

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 uVar10;
  float **ppfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  ulong uVar31;
  uint uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  int iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  byte bVar43;
  ulong uVar44;
  long lVar45;
  uint uVar46;
  ulong uVar47;
  uint uVar48;
  ulong *puVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2870;
  undefined8 uStack_2868;
  ulong *local_2858;
  ulong local_2850;
  ulong local_2848;
  long local_2840;
  ulong local_2838;
  ulong local_2830;
  ulong local_2828;
  long local_2820;
  Scene *local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  undefined1 local_2700 [32];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  RTCHitN local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined4 local_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  
  puVar49 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  local_2740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar94 = ZEXT3264(local_2740);
  local_2760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar95 = ZEXT3264(local_2760);
  local_2780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar96 = ZEXT3264(local_2780);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_27a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar97 = ZEXT3264(local_27a0);
  local_27c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar98 = ZEXT3264(local_27c0);
  local_27e0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar99 = ZEXT3264(local_27e0);
  fVar5 = fVar5 * 1.0000004;
  local_25c0._4_4_ = fVar5;
  local_25c0._0_4_ = fVar5;
  local_25c0._8_4_ = fVar5;
  local_25c0._12_4_ = fVar5;
  local_25c0._16_4_ = fVar5;
  local_25c0._20_4_ = fVar5;
  local_25c0._24_4_ = fVar5;
  local_25c0._28_4_ = fVar5;
  auVar83 = ZEXT3264(local_25c0);
  fVar6 = fVar6 * 1.0000004;
  local_25e0._4_4_ = fVar6;
  local_25e0._0_4_ = fVar6;
  local_25e0._8_4_ = fVar6;
  local_25e0._12_4_ = fVar6;
  local_25e0._16_4_ = fVar6;
  local_25e0._20_4_ = fVar6;
  local_25e0._24_4_ = fVar6;
  local_25e0._28_4_ = fVar6;
  auVar85 = ZEXT3264(local_25e0);
  fVar7 = fVar7 * 1.0000004;
  local_2600._4_4_ = fVar7;
  local_2600._0_4_ = fVar7;
  local_2600._8_4_ = fVar7;
  local_2600._12_4_ = fVar7;
  local_2600._16_4_ = fVar7;
  local_2600._20_4_ = fVar7;
  local_2600._24_4_ = fVar7;
  local_2600._28_4_ = fVar7;
  auVar87 = ZEXT3264(local_2600);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2850 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2828 = uVar50 ^ 0x20;
  local_2830 = local_2850 ^ 0x20;
  local_2848 = uVar47 ^ 0x20;
  iVar41 = (tray->tnear).field_0.i[k];
  local_2620._4_4_ = iVar41;
  local_2620._0_4_ = iVar41;
  local_2620._8_4_ = iVar41;
  local_2620._12_4_ = iVar41;
  local_2620._16_4_ = iVar41;
  local_2620._20_4_ = iVar41;
  local_2620._24_4_ = iVar41;
  local_2620._28_4_ = iVar41;
  auVar88 = ZEXT3264(local_2620);
  iVar41 = (tray->tfar).field_0.i[k];
  auVar77 = ZEXT3264(CONCAT428(iVar41,CONCAT424(iVar41,CONCAT420(iVar41,CONCAT416(iVar41,CONCAT412(
                                                  iVar41,CONCAT48(iVar41,CONCAT44(iVar41,iVar41)))))
                                               )));
  local_2710 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar75 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar89 = ZEXT3264(auVar75);
  auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  uVar52 = local_2850;
  local_2838 = local_2848;
  do {
    do {
      do {
        if (puVar49 == &local_23a0) {
          return;
        }
        pfVar12 = (float *)(puVar49 + -1);
        puVar49 = puVar49 + -2;
      } while (*(float *)(ray + k * 4 + 0x80) < *pfVar12);
      uVar51 = *puVar49;
      do {
        auVar75 = auVar88._0_32_;
        if ((uVar51 & 8) == 0) {
          auVar53 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar50),auVar94._0_32_);
          auVar53 = vmulps_avx512vl(auVar97._0_32_,auVar53);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar52),auVar95._0_32_);
          auVar54 = vmulps_avx512vl(auVar98._0_32_,auVar54);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar47),auVar96._0_32_);
          auVar54 = vmulps_avx512vl(auVar99._0_32_,auVar54);
          auVar54 = vmaxps_avx(auVar54,auVar75);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          in_ZMM15 = ZEXT3264(auVar53);
          auVar55 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar51 + 0x40 + local_2828),
                                    auVar94._0_32_);
          auVar54._4_4_ = auVar83._4_4_ * auVar55._4_4_;
          auVar54._0_4_ = auVar83._0_4_ * auVar55._0_4_;
          auVar54._8_4_ = auVar83._8_4_ * auVar55._8_4_;
          auVar54._12_4_ = auVar83._12_4_ * auVar55._12_4_;
          auVar54._16_4_ = auVar83._16_4_ * auVar55._16_4_;
          auVar54._20_4_ = auVar83._20_4_ * auVar55._20_4_;
          auVar54._24_4_ = auVar83._24_4_ * auVar55._24_4_;
          auVar54._28_4_ = auVar55._28_4_;
          auVar56 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar51 + 0x40 + local_2830),
                                    auVar95._0_32_);
          auVar55._4_4_ = auVar85._4_4_ * auVar56._4_4_;
          auVar55._0_4_ = auVar85._0_4_ * auVar56._0_4_;
          auVar55._8_4_ = auVar85._8_4_ * auVar56._8_4_;
          auVar55._12_4_ = auVar85._12_4_ * auVar56._12_4_;
          auVar55._16_4_ = auVar85._16_4_ * auVar56._16_4_;
          auVar55._20_4_ = auVar85._20_4_ * auVar56._20_4_;
          auVar55._24_4_ = auVar85._24_4_ * auVar56._24_4_;
          auVar55._28_4_ = auVar56._28_4_;
          auVar54 = vminps_avx(auVar54,auVar55);
          auVar55 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar51 + 0x40 + local_2838),
                                    auVar96._0_32_);
          auVar56._4_4_ = auVar87._4_4_ * auVar55._4_4_;
          auVar56._0_4_ = auVar87._0_4_ * auVar55._0_4_;
          auVar56._8_4_ = auVar87._8_4_ * auVar55._8_4_;
          auVar56._12_4_ = auVar87._12_4_ * auVar55._12_4_;
          auVar56._16_4_ = auVar87._16_4_ * auVar55._16_4_;
          auVar56._20_4_ = auVar87._20_4_ * auVar55._20_4_;
          auVar56._24_4_ = auVar87._24_4_ * auVar55._24_4_;
          auVar56._28_4_ = auVar55._28_4_;
          auVar55 = vminps_avx(auVar56,auVar77._0_32_);
          auVar54 = vminps_avx(auVar54,auVar55);
          uVar29 = vcmpps_avx512vl(auVar53,auVar54,2);
          local_2848 = CONCAT44((int)(local_2848 >> 0x20),(uint)(byte)uVar29);
        }
        if ((uVar51 & 8) == 0) {
          if (local_2848 == 0) {
            iVar41 = 4;
          }
          else {
            auVar53 = *(undefined1 (*) [32])(uVar51 & 0xfffffffffffffff0);
            auVar54 = ((undefined1 (*) [32])(uVar51 & 0xfffffffffffffff0))[1];
            auVar58 = auVar89._0_32_;
            auVar59 = auVar90._0_32_;
            auVar60 = in_ZMM15._0_32_;
            auVar55 = vpternlogd_avx512vl(auVar58,auVar60,auVar59,0xf8);
            uVar51 = local_2848 & 0xffffffff;
            auVar56 = vpcompressd_avx512vl(auVar55);
            bVar20 = (bool)((byte)uVar51 & 1);
            auVar57._0_4_ = (uint)bVar20 * auVar56._0_4_ | (uint)!bVar20 * auVar55._0_4_;
            bVar20 = (bool)((byte)(uVar51 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar20 * auVar56._4_4_ | (uint)!bVar20 * auVar55._4_4_;
            bVar20 = (bool)((byte)(uVar51 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar20 * auVar56._8_4_ | (uint)!bVar20 * auVar55._8_4_;
            bVar20 = (bool)((byte)(uVar51 >> 3) & 1);
            auVar57._12_4_ = (uint)bVar20 * auVar56._12_4_ | (uint)!bVar20 * auVar55._12_4_;
            bVar20 = (bool)((byte)(uVar51 >> 4) & 1);
            auVar57._16_4_ = (uint)bVar20 * auVar56._16_4_ | (uint)!bVar20 * auVar55._16_4_;
            bVar20 = (bool)((byte)(uVar51 >> 5) & 1);
            auVar57._20_4_ = (uint)bVar20 * auVar56._20_4_ | (uint)!bVar20 * auVar55._20_4_;
            bVar20 = (bool)((byte)(uVar51 >> 6) & 1);
            auVar57._24_4_ = (uint)bVar20 * auVar56._24_4_ | (uint)!bVar20 * auVar55._24_4_;
            bVar20 = (bool)((byte)(uVar51 >> 7) & 1);
            auVar57._28_4_ = (uint)bVar20 * auVar56._28_4_ | (uint)!bVar20 * auVar55._28_4_;
            auVar55 = vpermt2q_avx512vl(auVar53,auVar57,auVar54);
            uVar51 = auVar55._0_8_;
            iVar41 = 0;
            uVar44 = local_2848 - 1 & local_2848;
            if (uVar44 != 0) {
              auVar55 = vpshufd_avx2(auVar57,0x55);
              vpermt2q_avx512vl(auVar53,auVar55,auVar54);
              auVar56 = vpminsd_avx2(auVar57,auVar55);
              auVar55 = vpmaxsd_avx2(auVar57,auVar55);
              uVar44 = uVar44 - 1 & uVar44;
              if (uVar44 == 0) {
                auVar75 = vpermi2q_avx512vl(auVar56,auVar53,auVar54);
                uVar51 = auVar75._0_8_;
                auVar75 = vpermt2q_avx512vl(auVar53,auVar55,auVar54);
                *puVar49 = auVar75._0_8_;
                auVar75 = vpermd_avx2(auVar55,auVar60);
                *(int *)(puVar49 + 1) = auVar75._0_4_;
                puVar49 = puVar49 + 2;
              }
              else {
                auVar70 = vpshufd_avx2(auVar57,0xaa);
                vpermt2q_avx512vl(auVar53,auVar70,auVar54);
                auVar61 = vpminsd_avx2(auVar56,auVar70);
                auVar56 = vpmaxsd_avx2(auVar56,auVar70);
                auVar70 = vpminsd_avx2(auVar55,auVar56);
                auVar55 = vpmaxsd_avx2(auVar55,auVar56);
                uVar44 = uVar44 - 1 & uVar44;
                if (uVar44 == 0) {
                  auVar75 = vpermi2q_avx512vl(auVar61,auVar53,auVar54);
                  uVar51 = auVar75._0_8_;
                  auVar75 = vpermt2q_avx512vl(auVar53,auVar55,auVar54);
                  *puVar49 = auVar75._0_8_;
                  auVar75 = vpermd_avx2(auVar55,auVar60);
                  *(int *)(puVar49 + 1) = auVar75._0_4_;
                  auVar75 = vpermt2q_avx512vl(auVar53,auVar70,auVar54);
                  puVar49[2] = auVar75._0_8_;
                  auVar75 = vpermd_avx2(auVar70,auVar60);
                  *(int *)(puVar49 + 3) = auVar75._0_4_;
                  puVar49 = puVar49 + 4;
                }
                else {
                  auVar71 = vmovdqa64_avx512vl(auVar60);
                  auVar56 = vpshufd_avx2(auVar57,0xff);
                  vpermt2q_avx512vl(auVar53,auVar56,auVar54);
                  auVar60 = vpminsd_avx2(auVar61,auVar56);
                  auVar56 = vpmaxsd_avx2(auVar61,auVar56);
                  auVar61 = vpminsd_avx2(auVar70,auVar56);
                  auVar56 = vpmaxsd_avx2(auVar70,auVar56);
                  auVar70 = vpminsd_avx2(auVar55,auVar56);
                  auVar55 = vpmaxsd_avx2(auVar55,auVar56);
                  uVar44 = uVar44 - 1 & uVar44;
                  if (uVar44 == 0) {
                    auVar56 = vpermi2q_avx512vl(auVar60,auVar53,auVar54);
                    uVar51 = auVar56._0_8_;
                    auVar56 = vpermt2q_avx512vl(auVar53,auVar55,auVar54);
                    *puVar49 = auVar56._0_8_;
                    auVar56 = vmovdqa64_avx512vl(auVar71);
                    in_ZMM15 = ZEXT3264(auVar56);
                    auVar55 = vpermd_avx512vl(auVar55,auVar71);
                    *(int *)(puVar49 + 1) = auVar55._0_4_;
                    auVar55 = vpermt2q_avx512vl(auVar53,auVar70,auVar54);
                    puVar49[2] = auVar55._0_8_;
                    auVar55 = vpermd_avx512vl(auVar70,auVar71);
                    *(int *)(puVar49 + 3) = auVar55._0_4_;
                    auVar53 = vpermt2q_avx512vl(auVar53,auVar61,auVar54);
                    puVar49[4] = auVar53._0_8_;
                    auVar53 = vpermd_avx512vl(auVar61,auVar71);
                    *(int *)(puVar49 + 5) = auVar53._0_4_;
                    puVar49 = puVar49 + 6;
                    auVar94 = ZEXT3264(local_2740);
                    auVar95 = ZEXT3264(local_2760);
                    auVar96 = ZEXT3264(local_2780);
                    auVar97 = ZEXT3264(local_27a0);
                    auVar98 = ZEXT3264(local_27c0);
                    auVar99 = ZEXT3264(local_27e0);
                    auVar83 = ZEXT3264(auVar83._0_32_);
                    auVar85 = ZEXT3264(auVar85._0_32_);
                    auVar87 = ZEXT3264(auVar87._0_32_);
                    auVar88 = ZEXT3264(auVar75);
                    auVar89 = ZEXT3264(auVar58);
                    auVar90 = ZEXT3264(auVar59);
                  }
                  else {
                    auVar72 = valignd_avx512vl(auVar57,auVar57,3);
                    auVar56 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar57 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar56,auVar60);
                    auVar56 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar57 = vpermt2d_avx512vl(auVar57,auVar56,auVar61);
                    auVar57 = vpermt2d_avx512vl(auVar57,auVar56,auVar70);
                    auVar56 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar55 = vpermt2d_avx512vl(auVar57,auVar56,auVar55);
                    auVar88 = ZEXT3264(auVar55);
                    uVar51 = uVar44;
                    do {
                      auVar56 = auVar88._0_32_;
                      auVar61._8_4_ = 1;
                      auVar61._0_8_ = 0x100000001;
                      auVar61._12_4_ = 1;
                      auVar61._16_4_ = 1;
                      auVar61._20_4_ = 1;
                      auVar61._24_4_ = 1;
                      auVar61._28_4_ = 1;
                      auVar55 = vpermd_avx2(auVar61,auVar72);
                      auVar72 = valignd_avx512vl(auVar72,auVar72,1);
                      vpermt2q_avx512vl(auVar53,auVar72,auVar54);
                      uVar51 = uVar51 - 1 & uVar51;
                      uVar29 = vpcmpd_avx512vl(auVar55,auVar56,5);
                      auVar55 = vpmaxsd_avx2(auVar55,auVar56);
                      bVar43 = (byte)uVar29 << 1;
                      auVar56 = valignd_avx512vl(auVar56,auVar56,7);
                      bVar20 = (bool)((byte)uVar29 & 1);
                      auVar60._4_4_ = (uint)bVar20 * auVar56._4_4_ | (uint)!bVar20 * auVar55._4_4_;
                      auVar60._0_4_ = auVar55._0_4_;
                      bVar20 = (bool)(bVar43 >> 2 & 1);
                      auVar60._8_4_ = (uint)bVar20 * auVar56._8_4_ | (uint)!bVar20 * auVar55._8_4_;
                      bVar20 = (bool)(bVar43 >> 3 & 1);
                      auVar60._12_4_ =
                           (uint)bVar20 * auVar56._12_4_ | (uint)!bVar20 * auVar55._12_4_;
                      bVar20 = (bool)(bVar43 >> 4 & 1);
                      auVar60._16_4_ =
                           (uint)bVar20 * auVar56._16_4_ | (uint)!bVar20 * auVar55._16_4_;
                      bVar20 = (bool)(bVar43 >> 5 & 1);
                      auVar60._20_4_ =
                           (uint)bVar20 * auVar56._20_4_ | (uint)!bVar20 * auVar55._20_4_;
                      bVar20 = (bool)(bVar43 >> 6 & 1);
                      auVar60._24_4_ =
                           (uint)bVar20 * auVar56._24_4_ | (uint)!bVar20 * auVar55._24_4_;
                      auVar60._28_4_ =
                           (uint)(bVar43 >> 7) * auVar56._28_4_ |
                           (uint)!(bool)(bVar43 >> 7) * auVar55._28_4_;
                      auVar88 = ZEXT3264(auVar60);
                    } while (uVar51 != 0);
                    lVar45 = POPCOUNT(uVar44) + 3;
                    do {
                      auVar55 = vpermi2q_avx512vl(auVar60,auVar53,auVar54);
                      *puVar49 = auVar55._0_8_;
                      auVar56 = auVar88._0_32_;
                      auVar55 = vpermd_avx512vl(auVar56,auVar71);
                      *(int *)(puVar49 + 1) = auVar55._0_4_;
                      auVar60 = valignd_avx512vl(auVar56,auVar56,1);
                      puVar49 = puVar49 + 2;
                      auVar88 = ZEXT3264(auVar60);
                      lVar45 = lVar45 + -1;
                    } while (lVar45 != 0);
                    auVar53 = vpermt2q_avx512vl(auVar53,auVar60,auVar54);
                    uVar51 = auVar53._0_8_;
                    auVar94 = ZEXT3264(local_2740);
                    auVar95 = ZEXT3264(local_2760);
                    auVar96 = ZEXT3264(local_2780);
                    auVar97 = ZEXT3264(local_27a0);
                    auVar98 = ZEXT3264(local_27c0);
                    auVar99 = ZEXT3264(local_27e0);
                    auVar83 = ZEXT3264(auVar83._0_32_);
                    auVar85 = ZEXT3264(auVar85._0_32_);
                    auVar87 = ZEXT3264(auVar87._0_32_);
                    auVar88 = ZEXT3264(auVar75);
                    auVar89 = ZEXT3264(auVar58);
                    auVar90 = ZEXT3264(auVar59);
                    auVar75 = vmovdqa64_avx512vl(auVar71);
                    in_ZMM15 = ZEXT3264(auVar75);
                  }
                }
              }
            }
          }
        }
        else {
          iVar41 = 6;
        }
      } while (iVar41 == 0);
    } while (iVar41 != 6);
    local_25a0 = in_ZMM15._0_32_;
    local_2840 = (ulong)((uint)uVar51 & 0xf) - 8;
    if (local_2840 != 0) {
      uVar51 = uVar51 & 0xfffffffffffffff0;
      local_2820 = 0;
      do {
        lVar42 = local_2820 * 0x60;
        local_2818 = context->scene;
        ppfVar11 = (local_2818->vertices).items;
        pfVar12 = ppfVar11[*(uint *)(uVar51 + 0x48 + lVar42)];
        auVar64._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar51 + 0x28 + lVar42));
        auVar64._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar51 + 8 + lVar42));
        pfVar13 = ppfVar11[*(uint *)(uVar51 + 0x40 + lVar42)];
        auVar65._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar51 + 0x20 + lVar42));
        auVar65._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar51 + lVar42));
        pfVar14 = ppfVar11[*(uint *)(uVar51 + 0x4c + lVar42)];
        auVar67._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar51 + 0x2c + lVar42));
        auVar67._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar51 + 0xc + lVar42));
        pfVar15 = ppfVar11[*(uint *)(uVar51 + 0x44 + lVar42)];
        auVar68._16_16_ = *(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar51 + 0x24 + lVar42));
        auVar68._0_16_ = *(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar51 + 4 + lVar42));
        lVar45 = uVar51 + 0x40 + lVar42;
        local_2580 = *(undefined8 *)(lVar45 + 0x10);
        uStack_2578 = *(undefined8 *)(lVar45 + 0x18);
        uStack_2570 = local_2580;
        uStack_2568 = uStack_2578;
        lVar45 = uVar51 + 0x50 + lVar42;
        local_26e0 = *(undefined8 *)(lVar45 + 0x10);
        uStack_26d8 = *(undefined8 *)(lVar45 + 0x18);
        auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar51 + 0x10 + lVar42)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar51 + 0x18 + lVar42)))
        ;
        auVar21 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar51 + 0x10 + lVar42)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar51 + 0x18 + lVar42)))
        ;
        auVar24 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar51 + 0x14 + lVar42)),
                                *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar51 + 0x1c + lVar42)))
        ;
        auVar22 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar51 + 0x14 + lVar42)),
                                *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar51 + 0x1c + lVar42)))
        ;
        auVar25 = vunpcklps_avx(auVar21,auVar22);
        auVar26 = vunpcklps_avx(auVar23,auVar24);
        auVar21 = vunpckhps_avx(auVar23,auVar24);
        auVar24 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar51 + 0x30 + lVar42)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar51 + 0x38 + lVar42)))
        ;
        auVar22 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar51 + 0x30 + lVar42)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar51 + 0x38 + lVar42)))
        ;
        auVar27 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar51 + 0x34 + lVar42)),
                                *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar51 + 0x3c + lVar42)))
        ;
        auVar23 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar51 + 0x34 + lVar42)),
                                *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar51 + 0x3c + lVar42)))
        ;
        auVar23 = vunpcklps_avx(auVar22,auVar23);
        auVar28 = vunpcklps_avx(auVar24,auVar27);
        auVar22 = vunpckhps_avx(auVar24,auVar27);
        uStack_26d0 = local_26e0;
        uStack_26c8 = uStack_26d8;
        auVar75 = vunpcklps_avx(auVar68,auVar67);
        auVar53 = vunpcklps_avx(auVar65,auVar64);
        auVar55 = vunpcklps_avx(auVar53,auVar75);
        auVar53 = vunpckhps_avx(auVar53,auVar75);
        auVar75 = vunpckhps_avx(auVar68,auVar67);
        auVar54 = vunpckhps_avx(auVar65,auVar64);
        auVar54 = vunpcklps_avx(auVar54,auVar75);
        auVar66._16_16_ = auVar26;
        auVar66._0_16_ = auVar26;
        auVar69._16_16_ = auVar21;
        auVar69._0_16_ = auVar21;
        auVar63._16_16_ = auVar25;
        auVar63._0_16_ = auVar25;
        auVar73._16_16_ = auVar28;
        auVar73._0_16_ = auVar28;
        auVar91._16_16_ = auVar22;
        auVar91._0_16_ = auVar22;
        uVar8 = *(undefined4 *)(ray + k * 4);
        auVar93._4_4_ = uVar8;
        auVar93._0_4_ = uVar8;
        auVar93._8_4_ = uVar8;
        auVar93._12_4_ = uVar8;
        auVar93._16_4_ = uVar8;
        auVar93._20_4_ = uVar8;
        auVar93._24_4_ = uVar8;
        auVar93._28_4_ = uVar8;
        auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar78._4_4_ = uVar8;
        auVar78._0_4_ = uVar8;
        auVar78._8_4_ = uVar8;
        auVar78._12_4_ = uVar8;
        auVar78._16_4_ = uVar8;
        auVar78._20_4_ = uVar8;
        auVar78._24_4_ = uVar8;
        auVar78._28_4_ = uVar8;
        auVar62._16_16_ = auVar23;
        auVar62._0_16_ = auVar23;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar80._4_4_ = uVar8;
        auVar80._0_4_ = uVar8;
        auVar80._8_4_ = uVar8;
        auVar80._12_4_ = uVar8;
        auVar80._16_4_ = uVar8;
        auVar80._20_4_ = uVar8;
        auVar80._24_4_ = uVar8;
        auVar80._28_4_ = uVar8;
        fVar5 = *(float *)(ray + k * 4 + 0x60);
        auVar86._4_4_ = fVar5;
        auVar86._0_4_ = fVar5;
        auVar86._8_4_ = fVar5;
        auVar86._12_4_ = fVar5;
        auVar86._16_4_ = fVar5;
        auVar86._20_4_ = fVar5;
        auVar86._24_4_ = fVar5;
        auVar86._28_4_ = fVar5;
        auVar75 = vsubps_avx(auVar55,auVar93);
        auVar55 = vsubps_avx512vl(auVar53,auVar56);
        auVar54 = vsubps_avx512vl(auVar54,auVar57);
        auVar58 = vsubps_avx512vl(auVar66,auVar93);
        auVar59 = vsubps_avx512vl(auVar69,auVar56);
        auVar60 = vsubps_avx512vl(auVar63,auVar57);
        auVar61 = vsubps_avx512vl(auVar73,auVar93);
        auVar56 = vsubps_avx512vl(auVar91,auVar56);
        auVar57 = vsubps_avx512vl(auVar62,auVar57);
        auVar62 = vsubps_avx512vl(auVar61,auVar75);
        auVar53 = vsubps_avx(auVar56,auVar55);
        auVar63 = vsubps_avx512vl(auVar57,auVar54);
        auVar64 = vsubps_avx512vl(auVar75,auVar58);
        auVar65 = vsubps_avx512vl(auVar55,auVar59);
        auVar66 = vsubps_avx512vl(auVar54,auVar60);
        auVar67 = vsubps_avx512vl(auVar58,auVar61);
        auVar68 = vsubps_avx512vl(auVar59,auVar56);
        auVar69 = vsubps_avx512vl(auVar60,auVar57);
        auVar70 = vaddps_avx512vl(auVar61,auVar75);
        auVar84._0_4_ = auVar56._0_4_ + auVar55._0_4_;
        auVar84._4_4_ = auVar56._4_4_ + auVar55._4_4_;
        auVar84._8_4_ = auVar56._8_4_ + auVar55._8_4_;
        auVar84._12_4_ = auVar56._12_4_ + auVar55._12_4_;
        auVar84._16_4_ = auVar56._16_4_ + auVar55._16_4_;
        auVar84._20_4_ = auVar56._20_4_ + auVar55._20_4_;
        auVar84._24_4_ = auVar56._24_4_ + auVar55._24_4_;
        auVar84._28_4_ = auVar56._28_4_ + auVar55._28_4_;
        auVar71 = vaddps_avx512vl(auVar57,auVar54);
        auVar72 = vmulps_avx512vl(auVar84,auVar63);
        auVar72 = vfmsub231ps_avx512vl(auVar72,auVar53,auVar71);
        auVar71 = vmulps_avx512vl(auVar71,auVar62);
        auVar73 = vfmsub231ps_avx512vl(auVar71,auVar63,auVar70);
        auVar71._4_4_ = auVar53._4_4_ * auVar70._4_4_;
        auVar71._0_4_ = auVar53._0_4_ * auVar70._0_4_;
        auVar71._8_4_ = auVar53._8_4_ * auVar70._8_4_;
        auVar71._12_4_ = auVar53._12_4_ * auVar70._12_4_;
        auVar71._16_4_ = auVar53._16_4_ * auVar70._16_4_;
        auVar71._20_4_ = auVar53._20_4_ * auVar70._20_4_;
        auVar71._24_4_ = auVar53._24_4_ * auVar70._24_4_;
        auVar71._28_4_ = auVar70._28_4_;
        auVar21 = vfmsub231ps_fma(auVar71,auVar62,auVar84);
        auVar74._0_4_ = fVar5 * auVar21._0_4_;
        auVar74._4_4_ = fVar5 * auVar21._4_4_;
        auVar74._8_4_ = fVar5 * auVar21._8_4_;
        auVar74._12_4_ = fVar5 * auVar21._12_4_;
        auVar74._16_4_ = fVar5 * 0.0;
        auVar74._20_4_ = fVar5 * 0.0;
        auVar74._24_4_ = fVar5 * 0.0;
        auVar74._28_4_ = 0;
        auVar70 = vfmadd231ps_avx512vl(auVar74,auVar80,auVar73);
        local_2560 = vfmadd231ps_avx512vl(auVar70,auVar78,auVar72);
        auVar70 = vaddps_avx512vl(auVar75,auVar58);
        auVar71 = vaddps_avx512vl(auVar55,auVar59);
        auVar72 = vaddps_avx512vl(auVar54,auVar60);
        auVar73 = vmulps_avx512vl(auVar71,auVar66);
        auVar73 = vfmsub231ps_avx512vl(auVar73,auVar65,auVar72);
        auVar72 = vmulps_avx512vl(auVar72,auVar64);
        auVar74 = vfmsub231ps_avx512vl(auVar72,auVar66,auVar70);
        auVar70 = vmulps_avx512vl(auVar70,auVar65);
        auVar70 = vfmsub231ps_avx512vl(auVar70,auVar64,auVar71);
        auVar72._4_4_ = auVar70._4_4_ * fVar5;
        auVar72._0_4_ = auVar70._0_4_ * fVar5;
        auVar72._8_4_ = auVar70._8_4_ * fVar5;
        auVar72._12_4_ = auVar70._12_4_ * fVar5;
        auVar72._16_4_ = auVar70._16_4_ * fVar5;
        auVar72._20_4_ = auVar70._20_4_ * fVar5;
        auVar72._24_4_ = auVar70._24_4_ * fVar5;
        auVar72._28_4_ = auVar70._28_4_;
        auVar70 = vfmadd231ps_avx512vl(auVar72,auVar80,auVar74);
        local_2540 = vfmadd231ps_avx512vl(auVar70,auVar78,auVar73);
        auVar58 = vaddps_avx512vl(auVar58,auVar61);
        auVar56 = vaddps_avx512vl(auVar59,auVar56);
        auVar57 = vaddps_avx512vl(auVar60,auVar57);
        auVar59 = vmulps_avx512vl(auVar56,auVar69);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar68,auVar57);
        auVar57 = vmulps_avx512vl(auVar57,auVar67);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar69,auVar58);
        auVar58 = vmulps_avx512vl(auVar58,auVar68);
        auVar56 = vfmsub231ps_avx512vl(auVar58,auVar67,auVar56);
        auVar56 = vmulps_avx512vl(auVar56,auVar86);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar80,auVar57);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar78,auVar59);
        auVar92._0_4_ = local_2540._0_4_ + local_2560._0_4_;
        auVar92._4_4_ = local_2540._4_4_ + local_2560._4_4_;
        auVar92._8_4_ = local_2540._8_4_ + local_2560._8_4_;
        auVar92._12_4_ = local_2540._12_4_ + local_2560._12_4_;
        auVar92._16_4_ = local_2540._16_4_ + local_2560._16_4_;
        auVar92._20_4_ = local_2540._20_4_ + local_2560._20_4_;
        auVar92._24_4_ = local_2540._24_4_ + local_2560._24_4_;
        auVar92._28_4_ = local_2540._28_4_ + local_2560._28_4_;
        local_2520 = vaddps_avx512vl(auVar56,auVar92);
        auVar58._8_4_ = 0x7fffffff;
        auVar58._0_8_ = 0x7fffffff7fffffff;
        auVar58._12_4_ = 0x7fffffff;
        auVar58._16_4_ = 0x7fffffff;
        auVar58._20_4_ = 0x7fffffff;
        auVar58._24_4_ = 0x7fffffff;
        auVar58._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_2520,auVar58);
        auVar59._8_4_ = 0x34000000;
        auVar59._0_8_ = 0x3400000034000000;
        auVar59._12_4_ = 0x34000000;
        auVar59._16_4_ = 0x34000000;
        auVar59._20_4_ = 0x34000000;
        auVar59._24_4_ = 0x34000000;
        auVar59._28_4_ = 0x34000000;
        auVar57 = vmulps_avx512vl(local_2520,auVar59);
        auVar58 = vminps_avx512vl(local_2560,local_2540);
        auVar58 = vminps_avx512vl(auVar58,auVar56);
        auVar70._8_4_ = 0x80000000;
        auVar70._0_8_ = 0x8000000080000000;
        auVar70._12_4_ = 0x80000000;
        auVar70._16_4_ = 0x80000000;
        auVar70._20_4_ = 0x80000000;
        auVar70._24_4_ = 0x80000000;
        auVar70._28_4_ = 0x80000000;
        auVar59 = vxorps_avx512vl(auVar57,auVar70);
        uVar29 = vcmpps_avx512vl(auVar58,auVar59,5);
        auVar58 = vmaxps_avx512vl(local_2560,local_2540);
        auVar56 = vmaxps_avx512vl(auVar58,auVar56);
        uVar30 = vcmpps_avx512vl(auVar56,auVar57,2);
        bVar43 = (byte)uVar29 | (byte)uVar30;
        if (bVar43 != 0) {
          auVar56 = vmulps_avx512vl(auVar65,auVar63);
          auVar57 = vmulps_avx512vl(auVar62,auVar66);
          auVar58 = vmulps_avx512vl(auVar64,auVar53);
          auVar59 = vmulps_avx512vl(auVar68,auVar66);
          auVar60 = vmulps_avx512vl(auVar64,auVar69);
          auVar61 = vmulps_avx512vl(auVar67,auVar65);
          auVar53 = vfmsub213ps_avx512vl(auVar53,auVar66,auVar56);
          auVar70 = vfmsub213ps_avx512vl(auVar63,auVar64,auVar57);
          auVar71 = vfmsub213ps_avx512vl(auVar62,auVar65,auVar58);
          auVar72 = vfmsub213ps_avx512vl(auVar69,auVar65,auVar59);
          auVar62 = vfmsub213ps_avx512vl(auVar67,auVar66,auVar60);
          auVar63 = vfmsub213ps_avx512vl(auVar68,auVar64,auVar61);
          auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar56,auVar64);
          vandps_avx512vl(auVar59,auVar64);
          uVar52 = vcmpps_avx512vl(auVar64,auVar64,1);
          vandps_avx512vl(auVar57,auVar64);
          vandps_avx512vl(auVar60,auVar64);
          uVar44 = vcmpps_avx512vl(auVar64,auVar64,1);
          vandps_avx512vl(auVar58,auVar64);
          vandps_avx512vl(auVar61,auVar64);
          uVar31 = vcmpps_avx512vl(auVar64,auVar64,1);
          bVar20 = (bool)((byte)uVar52 & 1);
          local_2500._0_4_ = (float)((uint)bVar20 * auVar53._0_4_ | (uint)!bVar20 * auVar72._0_4_);
          bVar20 = (bool)((byte)(uVar52 >> 1) & 1);
          local_2500._4_4_ = (float)((uint)bVar20 * auVar53._4_4_ | (uint)!bVar20 * auVar72._4_4_);
          bVar20 = (bool)((byte)(uVar52 >> 2) & 1);
          local_2500._8_4_ = (float)((uint)bVar20 * auVar53._8_4_ | (uint)!bVar20 * auVar72._8_4_);
          bVar20 = (bool)((byte)(uVar52 >> 3) & 1);
          local_2500._12_4_ =
               (float)((uint)bVar20 * auVar53._12_4_ | (uint)!bVar20 * auVar72._12_4_);
          bVar20 = (bool)((byte)(uVar52 >> 4) & 1);
          local_2500._16_4_ =
               (float)((uint)bVar20 * auVar53._16_4_ | (uint)!bVar20 * auVar72._16_4_);
          bVar20 = (bool)((byte)(uVar52 >> 5) & 1);
          local_2500._20_4_ =
               (float)((uint)bVar20 * auVar53._20_4_ | (uint)!bVar20 * auVar72._20_4_);
          bVar20 = (bool)((byte)(uVar52 >> 6) & 1);
          local_2500._24_4_ =
               (float)((uint)bVar20 * auVar53._24_4_ | (uint)!bVar20 * auVar72._24_4_);
          bVar20 = SUB81(uVar52 >> 7,0);
          local_2500._28_4_ = (uint)bVar20 * auVar53._28_4_ | (uint)!bVar20 * auVar72._28_4_;
          bVar20 = (bool)((byte)uVar44 & 1);
          local_24e0._0_4_ = (float)((uint)bVar20 * auVar70._0_4_ | (uint)!bVar20 * auVar62._0_4_);
          bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
          local_24e0._4_4_ = (float)((uint)bVar20 * auVar70._4_4_ | (uint)!bVar20 * auVar62._4_4_);
          bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
          local_24e0._8_4_ = (float)((uint)bVar20 * auVar70._8_4_ | (uint)!bVar20 * auVar62._8_4_);
          bVar20 = (bool)((byte)(uVar44 >> 3) & 1);
          local_24e0._12_4_ =
               (float)((uint)bVar20 * auVar70._12_4_ | (uint)!bVar20 * auVar62._12_4_);
          bVar20 = (bool)((byte)(uVar44 >> 4) & 1);
          local_24e0._16_4_ =
               (float)((uint)bVar20 * auVar70._16_4_ | (uint)!bVar20 * auVar62._16_4_);
          bVar20 = (bool)((byte)(uVar44 >> 5) & 1);
          local_24e0._20_4_ =
               (float)((uint)bVar20 * auVar70._20_4_ | (uint)!bVar20 * auVar62._20_4_);
          bVar20 = (bool)((byte)(uVar44 >> 6) & 1);
          local_24e0._24_4_ =
               (float)((uint)bVar20 * auVar70._24_4_ | (uint)!bVar20 * auVar62._24_4_);
          bVar20 = SUB81(uVar44 >> 7,0);
          local_24e0._28_4_ = (uint)bVar20 * auVar70._28_4_ | (uint)!bVar20 * auVar62._28_4_;
          bVar20 = (bool)((byte)uVar31 & 1);
          local_24c0 = (float)((uint)bVar20 * auVar71._0_4_ | (uint)!bVar20 * auVar63._0_4_);
          bVar20 = (bool)((byte)(uVar31 >> 1) & 1);
          fStack_24bc = (float)((uint)bVar20 * auVar71._4_4_ | (uint)!bVar20 * auVar63._4_4_);
          bVar20 = (bool)((byte)(uVar31 >> 2) & 1);
          fStack_24b8 = (float)((uint)bVar20 * auVar71._8_4_ | (uint)!bVar20 * auVar63._8_4_);
          bVar20 = (bool)((byte)(uVar31 >> 3) & 1);
          fStack_24b4 = (float)((uint)bVar20 * auVar71._12_4_ | (uint)!bVar20 * auVar63._12_4_);
          bVar20 = (bool)((byte)(uVar31 >> 4) & 1);
          fStack_24b0 = (float)((uint)bVar20 * auVar71._16_4_ | (uint)!bVar20 * auVar63._16_4_);
          bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
          fStack_24ac = (float)((uint)bVar20 * auVar71._20_4_ | (uint)!bVar20 * auVar63._20_4_);
          bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
          fStack_24a8 = (float)((uint)bVar20 * auVar71._24_4_ | (uint)!bVar20 * auVar63._24_4_);
          bVar20 = SUB81(uVar31 >> 7,0);
          uStack_24a4 = (uint)bVar20 * auVar71._28_4_ | (uint)!bVar20 * auVar63._28_4_;
          auVar36._4_4_ = fVar5 * fStack_24bc;
          auVar36._0_4_ = fVar5 * local_24c0;
          auVar36._8_4_ = fVar5 * fStack_24b8;
          auVar36._12_4_ = fVar5 * fStack_24b4;
          auVar36._16_4_ = fVar5 * fStack_24b0;
          auVar36._20_4_ = fVar5 * fStack_24ac;
          auVar36._24_4_ = fVar5 * fStack_24a8;
          auVar36._28_4_ = fVar5;
          auVar21 = vfmadd213ps_fma(auVar80,local_24e0,auVar36);
          auVar21 = vfmadd213ps_fma(auVar78,local_2500,ZEXT1632(auVar21));
          auVar56 = ZEXT1632(CONCAT412(auVar21._12_4_ + auVar21._12_4_,
                                       CONCAT48(auVar21._8_4_ + auVar21._8_4_,
                                                CONCAT44(auVar21._4_4_ + auVar21._4_4_,
                                                         auVar21._0_4_ + auVar21._0_4_))));
          auVar81._0_4_ = auVar54._0_4_ * local_24c0;
          auVar81._4_4_ = auVar54._4_4_ * fStack_24bc;
          auVar81._8_4_ = auVar54._8_4_ * fStack_24b8;
          auVar81._12_4_ = auVar54._12_4_ * fStack_24b4;
          auVar81._16_4_ = auVar54._16_4_ * fStack_24b0;
          auVar81._20_4_ = auVar54._20_4_ * fStack_24ac;
          auVar81._24_4_ = auVar54._24_4_ * fStack_24a8;
          auVar81._28_4_ = 0;
          auVar21 = vfmadd213ps_fma(auVar55,local_24e0,auVar81);
          auVar22 = vfmadd213ps_fma(auVar75,local_2500,ZEXT1632(auVar21));
          auVar53 = vrcp14ps_avx512vl(auVar56);
          auVar75._8_4_ = 0x3f800000;
          auVar75._0_8_ = &DAT_3f8000003f800000;
          auVar75._12_4_ = 0x3f800000;
          auVar75._16_4_ = 0x3f800000;
          auVar75._20_4_ = 0x3f800000;
          auVar75._24_4_ = 0x3f800000;
          auVar75._28_4_ = 0x3f800000;
          auVar75 = vfnmadd213ps_avx512vl(auVar53,auVar56,auVar75);
          auVar21 = vfmadd132ps_fma(auVar75,auVar53,auVar53);
          local_2440._28_4_ = auVar54._28_4_;
          local_2440._0_28_ =
               ZEXT1628(CONCAT412((auVar22._12_4_ + auVar22._12_4_) * auVar21._12_4_,
                                  CONCAT48((auVar22._8_4_ + auVar22._8_4_) * auVar21._8_4_,
                                           CONCAT44((auVar22._4_4_ + auVar22._4_4_) * auVar21._4_4_,
                                                    (auVar22._0_4_ + auVar22._0_4_) * auVar21._0_4_)
                                          )));
          auVar77 = ZEXT3264(local_2440);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar53._4_4_ = uVar8;
          auVar53._0_4_ = uVar8;
          auVar53._8_4_ = uVar8;
          auVar53._12_4_ = uVar8;
          auVar53._16_4_ = uVar8;
          auVar53._20_4_ = uVar8;
          auVar53._24_4_ = uVar8;
          auVar53._28_4_ = uVar8;
          uVar29 = vcmpps_avx512vl(local_2440,auVar53,0xd);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar33._4_4_ = uVar8;
          auVar33._0_4_ = uVar8;
          auVar33._8_4_ = uVar8;
          auVar33._12_4_ = uVar8;
          auVar33._16_4_ = uVar8;
          auVar33._20_4_ = uVar8;
          auVar33._24_4_ = uVar8;
          auVar33._28_4_ = uVar8;
          uVar30 = vcmpps_avx512vl(local_2440,auVar33,2);
          bVar43 = (byte)uVar29 & (byte)uVar30 & bVar43;
          if (bVar43 != 0) {
            uVar52 = vcmpps_avx512vl(auVar56,_DAT_02020f00,4);
            uVar52 = bVar43 & uVar52;
            local_24a0 = (byte)uVar52;
            if (local_24a0 != 0) {
              local_23c0 = 0xf0;
              auVar34._8_4_ = 0x219392ef;
              auVar34._0_8_ = 0x219392ef219392ef;
              auVar34._12_4_ = 0x219392ef;
              auVar34._16_4_ = 0x219392ef;
              auVar34._20_4_ = 0x219392ef;
              auVar34._24_4_ = 0x219392ef;
              auVar34._28_4_ = 0x219392ef;
              uVar44 = vcmpps_avx512vl(local_2520,auVar34,5);
              auVar53 = vrcp14ps_avx512vl(local_2520);
              auVar79._8_4_ = 0x3f800000;
              auVar79._0_8_ = &DAT_3f8000003f800000;
              auVar79._12_4_ = 0x3f800000;
              auVar79._16_4_ = 0x3f800000;
              auVar79._20_4_ = 0x3f800000;
              auVar79._24_4_ = 0x3f800000;
              auVar79._28_4_ = 0x3f800000;
              auVar21 = vfnmadd213ps_fma(local_2520,auVar53,auVar79);
              auVar75 = vfmadd132ps_avx512vl(ZEXT1632(auVar21),auVar53,auVar53);
              fVar6 = (float)((uint)((byte)uVar44 & 1) * auVar75._0_4_);
              fVar5 = (float)((uint)((byte)(uVar44 >> 1) & 1) * auVar75._4_4_);
              fVar7 = (float)((uint)((byte)(uVar44 >> 2) & 1) * auVar75._8_4_);
              fVar1 = (float)((uint)((byte)(uVar44 >> 3) & 1) * auVar75._12_4_);
              fVar2 = (float)((uint)((byte)(uVar44 >> 4) & 1) * auVar75._16_4_);
              fVar3 = (float)((uint)((byte)(uVar44 >> 5) & 1) * auVar75._20_4_);
              fVar4 = (float)((uint)((byte)(uVar44 >> 6) & 1) * auVar75._24_4_);
              auVar37._4_4_ = fVar5 * local_2560._4_4_;
              auVar37._0_4_ = fVar6 * local_2560._0_4_;
              auVar37._8_4_ = fVar7 * local_2560._8_4_;
              auVar37._12_4_ = fVar1 * local_2560._12_4_;
              auVar37._16_4_ = fVar2 * local_2560._16_4_;
              auVar37._20_4_ = fVar3 * local_2560._20_4_;
              auVar37._24_4_ = fVar4 * local_2560._24_4_;
              auVar37._28_4_ = local_2560._28_4_;
              auVar75 = vminps_avx(auVar37,auVar79);
              auVar38._4_4_ = local_2540._4_4_ * fVar5;
              auVar38._0_4_ = local_2540._0_4_ * fVar6;
              auVar38._8_4_ = local_2540._8_4_ * fVar7;
              auVar38._12_4_ = local_2540._12_4_ * fVar1;
              auVar38._16_4_ = local_2540._16_4_ * fVar2;
              auVar38._20_4_ = local_2540._20_4_ * fVar3;
              auVar38._24_4_ = local_2540._24_4_ * fVar4;
              auVar38._28_4_ = auVar53._28_4_;
              auVar53 = vminps_avx(auVar38,auVar79);
              auVar54 = vsubps_avx(auVar79,auVar75);
              auVar55 = vsubps_avx(auVar79,auVar53);
              local_2460 = vblendps_avx(auVar53,auVar54,0xf0);
              local_2480 = vblendps_avx(auVar75,auVar55,0xf0);
              fVar5 = (float)DAT_02060940;
              fVar6 = DAT_02060940._4_4_;
              fVar7 = DAT_02060940._8_4_;
              fVar1 = DAT_02060940._12_4_;
              fVar2 = DAT_02060940._16_4_;
              fVar3 = DAT_02060940._20_4_;
              fVar4 = DAT_02060940._24_4_;
              local_2420[0] = local_2500._0_4_ * fVar5;
              local_2420[1] = local_2500._4_4_ * fVar6;
              local_2420[2] = local_2500._8_4_ * fVar7;
              local_2420[3] = local_2500._12_4_ * fVar1;
              fStack_2410 = local_2500._16_4_ * fVar2;
              fStack_240c = local_2500._20_4_ * fVar3;
              fStack_2408 = local_2500._24_4_ * fVar4;
              uStack_2404 = local_2500._28_4_;
              local_2400[0] = local_24e0._0_4_ * fVar5;
              local_2400[1] = local_24e0._4_4_ * fVar6;
              local_2400[2] = local_24e0._8_4_ * fVar7;
              local_2400[3] = local_24e0._12_4_ * fVar1;
              fStack_23f0 = local_24e0._16_4_ * fVar2;
              fStack_23ec = local_24e0._20_4_ * fVar3;
              fStack_23e8 = local_24e0._24_4_ * fVar4;
              uStack_23e4 = local_24e0._28_4_;
              local_23e0[0] = local_24c0 * fVar5;
              local_23e0[1] = fStack_24bc * fVar6;
              local_23e0[2] = fStack_24b8 * fVar7;
              local_23e0[3] = fStack_24b4 * fVar1;
              fStack_23d0 = fStack_24b0 * fVar2;
              fStack_23cc = fStack_24ac * fVar3;
              fStack_23c8 = fStack_24a8 * fVar4;
              uStack_23c4 = uStack_24a4;
              auVar82._8_4_ = 0x7f800000;
              auVar82._0_8_ = 0x7f8000007f800000;
              auVar82._12_4_ = 0x7f800000;
              auVar82._16_4_ = 0x7f800000;
              auVar82._20_4_ = 0x7f800000;
              auVar82._24_4_ = 0x7f800000;
              auVar82._28_4_ = 0x7f800000;
              auVar83 = ZEXT3264(auVar82);
              auVar75 = vblendmps_avx512vl(auVar82,local_2440);
              auVar76._0_4_ =
                   (uint)(local_24a0 & 1) * auVar75._0_4_ |
                   (uint)!(bool)(local_24a0 & 1) * (int)(local_24c0 * fVar5);
              bVar20 = (bool)((byte)(uVar52 >> 1) & 1);
              auVar76._4_4_ =
                   (uint)bVar20 * auVar75._4_4_ | (uint)!bVar20 * (int)(fStack_24bc * fVar6);
              bVar20 = (bool)((byte)(uVar52 >> 2) & 1);
              auVar76._8_4_ =
                   (uint)bVar20 * auVar75._8_4_ | (uint)!bVar20 * (int)(fStack_24b8 * fVar7);
              bVar20 = (bool)((byte)(uVar52 >> 3) & 1);
              auVar76._12_4_ =
                   (uint)bVar20 * auVar75._12_4_ | (uint)!bVar20 * (int)(fStack_24b4 * fVar1);
              bVar20 = (bool)((byte)(uVar52 >> 4) & 1);
              auVar76._16_4_ =
                   (uint)bVar20 * auVar75._16_4_ | (uint)!bVar20 * (int)(fStack_24b0 * fVar2);
              bVar20 = (bool)((byte)(uVar52 >> 5) & 1);
              auVar76._20_4_ =
                   (uint)bVar20 * auVar75._20_4_ | (uint)!bVar20 * (int)(fStack_24ac * fVar3);
              bVar20 = (bool)((byte)(uVar52 >> 6) & 1);
              auVar76._24_4_ =
                   (uint)bVar20 * auVar75._24_4_ | (uint)!bVar20 * (int)(fStack_24a8 * fVar4);
              bVar20 = SUB81(uVar52 >> 7,0);
              auVar76._28_4_ = (uint)bVar20 * auVar75._28_4_ | !bVar20 * uStack_24a4;
              auVar75 = vshufps_avx(auVar76,auVar76,0xb1);
              auVar75 = vminps_avx(auVar76,auVar75);
              auVar53 = vshufpd_avx(auVar75,auVar75,5);
              auVar75 = vminps_avx(auVar75,auVar53);
              auVar53 = vpermpd_avx2(auVar75,0x4e);
              auVar75 = vminps_avx(auVar75,auVar53);
              uVar29 = vcmpps_avx512vl(auVar76,auVar75,0);
              bVar43 = (byte)uVar29 & local_24a0;
              do {
                uVar46 = (uint)uVar52;
                if (bVar43 != 0) {
                  uVar46 = (uint)bVar43;
                }
                uVar32 = 0;
                for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x80000000) {
                  uVar32 = uVar32 + 1;
                }
                uVar48 = uVar32 & 0xff;
                uVar46 = *(uint *)((long)&local_2580 + (ulong)uVar48 * 4);
                pGVar16 = (local_2818->geometries).items[uVar46].ptr;
                auVar75 = auVar76;
                if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar52 = (ulong)(byte)(~(byte)(1 << (uVar32 & 0x1f)) & (byte)uVar52);
LAB_00857000:
                  bVar20 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar44 = (ulong)(uVar48 * 4);
                    uVar8 = *(undefined4 *)(local_2480 + uVar44);
                    local_2680._4_4_ = uVar8;
                    local_2680._0_4_ = uVar8;
                    local_2680._8_4_ = uVar8;
                    local_2680._12_4_ = uVar8;
                    local_2670 = *(undefined4 *)(local_2460 + uVar44);
                    local_2650 = vpbroadcastd_avx512vl();
                    uVar8 = *(undefined4 *)((long)&local_26e0 + uVar44);
                    local_2660._4_4_ = uVar8;
                    local_2660._0_4_ = uVar8;
                    local_2660._8_4_ = uVar8;
                    local_2660._12_4_ = uVar8;
                    uVar8 = *(undefined4 *)((long)local_2420 + uVar44);
                    uVar10 = *(undefined4 *)((long)local_2400 + uVar44);
                    local_26a0._4_4_ = uVar10;
                    local_26a0._0_4_ = uVar10;
                    local_26a0._8_4_ = uVar10;
                    local_26a0._12_4_ = uVar10;
                    uVar10 = *(undefined4 *)((long)local_23e0 + uVar44);
                    local_2690._4_4_ = uVar10;
                    local_2690._0_4_ = uVar10;
                    local_2690._8_4_ = uVar10;
                    local_2690._12_4_ = uVar10;
                    local_26b0[0] = (RTCHitN)(char)uVar8;
                    local_26b0[1] = (RTCHitN)(char)((uint)uVar8 >> 8);
                    local_26b0[2] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                    local_26b0[3] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                    local_26b0[4] = (RTCHitN)(char)uVar8;
                    local_26b0[5] = (RTCHitN)(char)((uint)uVar8 >> 8);
                    local_26b0[6] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                    local_26b0[7] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                    local_26b0[8] = (RTCHitN)(char)uVar8;
                    local_26b0[9] = (RTCHitN)(char)((uint)uVar8 >> 8);
                    local_26b0[10] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                    local_26b0[0xb] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                    local_26b0[0xc] = (RTCHitN)(char)uVar8;
                    local_26b0[0xd] = (RTCHitN)(char)((uint)uVar8 >> 8);
                    local_26b0[0xe] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                    local_26b0[0xf] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                    uStack_266c = local_2670;
                    uStack_2668 = local_2670;
                    uStack_2664 = local_2670;
                    vpcmpeqd_avx2(ZEXT1632(local_2680),ZEXT1632(local_2680));
                    uStack_263c = context->user->instID[0];
                    local_2640 = uStack_263c;
                    uStack_2638 = uStack_263c;
                    uStack_2634 = uStack_263c;
                    uStack_2630 = context->user->instPrimID[0];
                    uStack_262c = uStack_2630;
                    uStack_2628 = uStack_2630;
                    uStack_2624 = uStack_2630;
                    uVar9 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar44);
                    local_2870 = local_2710._0_8_;
                    uStack_2868 = local_2710._8_8_;
                    local_2810.valid = (int *)&local_2870;
                    local_2810.geometryUserPtr = pGVar16->userPtr;
                    local_2810.context = context->user;
                    local_2810.hit = local_26b0;
                    local_2810.N = 4;
                    local_2700 = auVar77._0_32_;
                    local_2810.ray = (RTCRayN *)ray;
                    if (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_2858 = puVar49;
                      (*pGVar16->intersectionFilterN)(&local_2810);
                      auVar77 = ZEXT3264(local_2700);
                      auVar83 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar99 = ZEXT3264(local_27e0);
                      auVar98 = ZEXT3264(local_27c0);
                      auVar97 = ZEXT3264(local_27a0);
                      auVar96 = ZEXT3264(local_2780);
                      auVar95 = ZEXT3264(local_2760);
                      auVar94 = ZEXT3264(local_2740);
                      puVar49 = local_2858;
                    }
                    auVar21._8_8_ = uStack_2868;
                    auVar21._0_8_ = local_2870;
                    uVar44 = vptestmd_avx512vl(auVar21,auVar21);
                    if ((uVar44 & 0xf) == 0) {
LAB_00857338:
                      auVar75 = ZEXT432(uVar9);
                      *(uint *)(ray + k * 4 + 0x80) = uVar9;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var17)(&local_2810);
                        auVar77 = ZEXT3264(local_2700);
                        auVar83 = ZEXT3264(CONCAT428(0x7f800000,
                                                     CONCAT424(0x7f800000,
                                                               CONCAT420(0x7f800000,
                                                                         CONCAT416(0x7f800000,
                                                                                   CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar99 = ZEXT3264(local_27e0);
                        auVar98 = ZEXT3264(local_27c0);
                        auVar97 = ZEXT3264(local_27a0);
                        auVar96 = ZEXT3264(local_2780);
                        auVar95 = ZEXT3264(local_2760);
                        auVar94 = ZEXT3264(local_2740);
                      }
                      auVar22._8_8_ = uStack_2868;
                      auVar22._0_8_ = local_2870;
                      uVar44 = vptestmd_avx512vl(auVar22,auVar22);
                      uVar44 = uVar44 & 0xf;
                      bVar43 = (byte)uVar44;
                      if (bVar43 == 0) goto LAB_00857338;
                      iVar41 = *(int *)(local_2810.hit + 4);
                      iVar39 = *(int *)(local_2810.hit + 8);
                      iVar40 = *(int *)(local_2810.hit + 0xc);
                      bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar19 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xc0) =
                           (uint)(bVar43 & 1) * *(int *)local_2810.hit |
                           (uint)!(bool)(bVar43 & 1) * *(int *)(local_2810.ray + 0xc0);
                      *(uint *)(local_2810.ray + 0xc4) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_2810.ray + 0xc4);
                      *(uint *)(local_2810.ray + 200) =
                           (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_2810.ray + 200);
                      *(uint *)(local_2810.ray + 0xcc) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_2810.ray + 0xcc);
                      iVar41 = *(int *)(local_2810.hit + 0x14);
                      iVar39 = *(int *)(local_2810.hit + 0x18);
                      iVar40 = *(int *)(local_2810.hit + 0x1c);
                      bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar19 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xd0) =
                           (uint)(bVar43 & 1) * *(int *)(local_2810.hit + 0x10) |
                           (uint)!(bool)(bVar43 & 1) * *(int *)(local_2810.ray + 0xd0);
                      *(uint *)(local_2810.ray + 0xd4) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_2810.ray + 0xd4);
                      *(uint *)(local_2810.ray + 0xd8) =
                           (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xd8);
                      *(uint *)(local_2810.ray + 0xdc) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_2810.ray + 0xdc);
                      iVar41 = *(int *)(local_2810.hit + 0x24);
                      iVar39 = *(int *)(local_2810.hit + 0x28);
                      iVar40 = *(int *)(local_2810.hit + 0x2c);
                      bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar19 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xe0) =
                           (uint)(bVar43 & 1) * *(int *)(local_2810.hit + 0x20) |
                           (uint)!(bool)(bVar43 & 1) * *(int *)(local_2810.ray + 0xe0);
                      *(uint *)(local_2810.ray + 0xe4) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_2810.ray + 0xe4);
                      *(uint *)(local_2810.ray + 0xe8) =
                           (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xe8);
                      *(uint *)(local_2810.ray + 0xec) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_2810.ray + 0xec);
                      iVar41 = *(int *)(local_2810.hit + 0x34);
                      iVar39 = *(int *)(local_2810.hit + 0x38);
                      iVar40 = *(int *)(local_2810.hit + 0x3c);
                      bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar19 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xf0) =
                           (uint)(bVar43 & 1) * *(int *)(local_2810.hit + 0x30) |
                           (uint)!(bool)(bVar43 & 1) * *(int *)(local_2810.ray + 0xf0);
                      *(uint *)(local_2810.ray + 0xf4) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_2810.ray + 0xf4);
                      *(uint *)(local_2810.ray + 0xf8) =
                           (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xf8);
                      *(uint *)(local_2810.ray + 0xfc) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_2810.ray + 0xfc);
                      iVar41 = *(int *)(local_2810.hit + 0x44);
                      iVar39 = *(int *)(local_2810.hit + 0x48);
                      iVar40 = *(int *)(local_2810.hit + 0x4c);
                      bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar19 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0x100) =
                           (uint)(bVar43 & 1) * *(int *)(local_2810.hit + 0x40) |
                           (uint)!(bool)(bVar43 & 1) * *(int *)(local_2810.ray + 0x100);
                      *(uint *)(local_2810.ray + 0x104) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_2810.ray + 0x104);
                      *(uint *)(local_2810.ray + 0x108) =
                           (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_2810.ray + 0x108);
                      *(uint *)(local_2810.ray + 0x10c) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_2810.ray + 0x10c);
                      auVar21 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x50));
                      *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar21;
                      auVar21 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x60));
                      *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar21;
                      auVar21 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x70));
                      *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar21;
                      auVar75 = ZEXT1632(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                      auVar21 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                      *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar21;
                    }
                    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar35._4_4_ = uVar8;
                    auVar35._0_4_ = uVar8;
                    auVar35._8_4_ = uVar8;
                    auVar35._12_4_ = uVar8;
                    auVar35._16_4_ = uVar8;
                    auVar35._20_4_ = uVar8;
                    auVar35._24_4_ = uVar8;
                    auVar35._28_4_ = uVar8;
                    uVar44 = vcmpps_avx512vl(auVar77._0_32_,auVar35,2);
                    uVar52 = (byte)(~(byte)(1 << (uVar32 & 0x1f)) & (byte)uVar52) & uVar44;
                    goto LAB_00857000;
                  }
                  bVar20 = false;
                }
                if (!bVar20) {
                  uVar52 = (ulong)(uVar48 << 2);
                  uVar8 = *(undefined4 *)(local_2480 + uVar52);
                  uVar10 = *(undefined4 *)(local_2460 + uVar52);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar52);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_2420 + uVar52);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2400 + uVar52);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_23e0 + uVar52);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar8;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar10;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_26e0 + uVar52)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar46;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar43 = (byte)uVar52;
                if (bVar43 == 0) break;
                auVar53 = vblendmps_avx512vl(auVar83._0_32_,auVar77._0_32_);
                auVar76._0_4_ =
                     (uint)(bVar43 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar43 & 1) * auVar75._0_4_;
                bVar20 = (bool)((byte)(uVar52 >> 1) & 1);
                auVar76._4_4_ = (uint)bVar20 * auVar53._4_4_ | (uint)!bVar20 * auVar75._4_4_;
                bVar20 = (bool)((byte)(uVar52 >> 2) & 1);
                auVar76._8_4_ = (uint)bVar20 * auVar53._8_4_ | (uint)!bVar20 * auVar75._8_4_;
                bVar20 = (bool)((byte)(uVar52 >> 3) & 1);
                auVar76._12_4_ = (uint)bVar20 * auVar53._12_4_ | (uint)!bVar20 * auVar75._12_4_;
                bVar20 = (bool)((byte)(uVar52 >> 4) & 1);
                auVar76._16_4_ = (uint)bVar20 * auVar53._16_4_ | (uint)!bVar20 * auVar75._16_4_;
                bVar20 = (bool)((byte)(uVar52 >> 5) & 1);
                auVar76._20_4_ = (uint)bVar20 * auVar53._20_4_ | (uint)!bVar20 * auVar75._20_4_;
                bVar20 = (bool)((byte)(uVar52 >> 6) & 1);
                auVar76._24_4_ = (uint)bVar20 * auVar53._24_4_ | (uint)!bVar20 * auVar75._24_4_;
                bVar20 = SUB81(uVar52 >> 7,0);
                auVar76._28_4_ = (uint)bVar20 * auVar53._28_4_ | (uint)!bVar20 * auVar75._28_4_;
                auVar75 = vshufps_avx(auVar76,auVar76,0xb1);
                auVar75 = vminps_avx(auVar76,auVar75);
                auVar53 = vshufpd_avx(auVar75,auVar75,5);
                auVar75 = vminps_avx(auVar75,auVar53);
                auVar53 = vpermpd_avx2(auVar75,0x4e);
                auVar75 = vminps_avx(auVar75,auVar53);
                uVar29 = vcmpps_avx512vl(auVar76,auVar75,0);
                bVar43 = (byte)uVar29 & bVar43;
              } while( true );
            }
          }
        }
        local_2820 = local_2820 + 1;
      } while (local_2820 != local_2840);
    }
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar77 = ZEXT3264(CONCAT428(uVar8,CONCAT424(uVar8,CONCAT420(uVar8,CONCAT416(uVar8,CONCAT412(
                                                  uVar8,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))))))));
    auVar83 = ZEXT3264(local_25c0);
    auVar85 = ZEXT3264(local_25e0);
    auVar87 = ZEXT3264(local_2600);
    auVar88 = ZEXT3264(local_2620);
    auVar75 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar89 = ZEXT3264(auVar75);
    auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    in_ZMM15 = ZEXT3264(local_25a0);
    uVar52 = local_2850;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }